

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O3

void __thiscall QProgressDialog::setBar(QProgressDialog *this,QProgressBar *bar)

{
  QProgressDialogPrivate *this_00;
  QProgressBar *pQVar1;
  
  if (bar == (QProgressBar *)0x0) {
    setBar();
  }
  else {
    this_00 = *(QProgressDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
    pQVar1 = this_00->bar;
    if (pQVar1 != bar) {
      if (pQVar1 != (QProgressBar *)0x0) {
        (**(code **)(*(long *)&pQVar1->super_QWidget + 0x20))();
      }
      this_00->bar = bar;
      QProgressDialogPrivate::adoptChildWidget(this_00,&bar->super_QWidget);
      return;
    }
    setBar();
  }
  return;
}

Assistant:

void QProgressDialog::setBar(QProgressBar *bar)
{
    Q_D(QProgressDialog);
    if (Q_UNLIKELY(!bar)) {
        qWarning("QProgressDialog::setBar: Cannot set a null progress bar");
        return;
    }
#ifndef QT_NO_DEBUG
    if (Q_UNLIKELY(value() > 0))
        qWarning("QProgressDialog::setBar: Cannot set a new progress bar "
                  "while the old one is active");
#endif
    if (Q_UNLIKELY(bar == d->bar)) {
        qWarning("QProgressDialog::setBar: Attempt to set the same progress bar again");
        return;
    }
    delete d->bar;
    d->bar = bar;
    d->adoptChildWidget(bar);
}